

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readNumber(OurReader *this,bool checkInf)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  
  pbVar1 = (byte *)this->end_;
  pbVar3 = (byte *)this->current_;
  if ((checkInf && pbVar3 != pbVar1) && (*pbVar3 == 0x49)) {
    this->current_ = (Location)(pbVar3 + 1);
    bVar2 = false;
  }
  else {
    bVar5 = 0x30;
    while ((byte)(bVar5 - 0x30) < 10) {
      bVar5 = 0;
      this->current_ = (Location)pbVar3;
      if (pbVar3 < pbVar1) {
        bVar5 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      }
    }
    if (bVar5 == 0x2e) {
      this->current_ = (Location)pbVar3;
      if (pbVar3 < pbVar1) goto LAB_003b5d53;
      bVar5 = 0;
      while ((byte)(bVar5 - 0x30) < 10) {
        bVar5 = 0;
        this->current_ = (Location)pbVar3;
        if (pbVar3 < pbVar1) {
LAB_003b5d53:
          bVar5 = *pbVar3;
          pbVar3 = pbVar3 + 1;
        }
      }
    }
    bVar2 = true;
    if ((bVar5 & 0xdf) == 0x45) {
      this->current_ = (Location)pbVar3;
      if (pbVar3 < pbVar1) {
        pbVar4 = pbVar3 + 1;
        bVar5 = *pbVar3;
        if ((bVar5 == 0x2d) || (bVar5 == 0x2b)) {
          this->current_ = (Location)pbVar4;
          if (pbVar4 < pbVar1) {
            pbVar3 = pbVar3 + 2;
            goto LAB_003b5db6;
          }
          bVar5 = 0;
        }
      }
      else {
        bVar5 = 0;
        pbVar4 = pbVar3;
      }
      while (((byte)(bVar5 - 0x30) < 10 && (this->current_ = (Location)pbVar4, pbVar4 < pbVar1))) {
        pbVar3 = pbVar4 + 1;
LAB_003b5db6:
        bVar5 = *pbVar4;
        pbVar4 = pbVar3;
      }
    }
  }
  return bVar2;
}

Assistant:

bool OurReader::readNumber(bool checkInf) {
  const char *p = current_;
  if (checkInf && p != end_ && *p == 'I') {
    current_ = ++p;
    return false;
  }
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : '\0';
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  return true;
}